

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint *puVar15;
  int iVar16;
  short sVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint *puVar21;
  bool bVar22;
  char buffer [4];
  undefined4 local_34;
  
  if (hbSize < 4) {
    local_34 = 0;
    memcpy(&local_34,headerBuffer,hbSize);
    sVar9 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,&local_34,4);
    sVar11 = 0xffffffffffffffec;
    if (sVar9 <= hbSize) {
      sVar11 = sVar9;
    }
    if (0xffffffffffffff88 < sVar9) {
      sVar11 = sVar9;
    }
  }
  else {
    memset(normalizedCounter,0,(ulong)(*maxSVPtr + 1) * 2);
    uVar18 = *headerBuffer;
    uVar19 = uVar18 & 0xf;
    sVar11 = 0xffffffffffffffd4;
    if (uVar19 < 0xb) {
      iVar13 = 0x20 << (sbyte)uVar19;
      *tableLogPtr = uVar19 + 5;
      uVar4 = *maxSVPtr;
      iVar16 = iVar13 + 1;
      iVar20 = uVar19 + 6;
      uVar18 = uVar18 >> 4;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar15 = (uint *)((long)headerBuffer + (hbSize - 4));
      uVar19 = 4;
      bVar22 = true;
      uVar8 = 0;
      puVar21 = (uint *)headerBuffer;
      do {
        uVar5 = uVar8;
        if (!bVar22) {
          sVar17 = (short)uVar18;
          uVar6 = uVar8;
          while (sVar17 == -1) {
            if (puVar21 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar3 = (uint *)((long)puVar21 + 2);
              puVar21 = (uint *)((long)puVar21 + 2);
              uVar18 = *puVar3 >> ((byte)uVar19 & 0x1f);
            }
            else {
              uVar18 = uVar18 >> 0x10;
              uVar19 = uVar19 + 0x10;
            }
            uVar6 = uVar6 + 0x18;
            sVar17 = (short)uVar18;
          }
          for (; (uVar18 & 3) == 3; uVar18 = uVar18 >> 2) {
            uVar6 = uVar6 + 3;
            uVar19 = uVar19 + 2;
          }
          uVar6 = uVar6 + (uVar18 & 3);
          uVar19 = uVar19 + 2;
          if (uVar6 <= uVar4) {
            if (uVar8 < uVar6) {
              memset(normalizedCounter + uVar8,0,(ulong)(~uVar8 + uVar6) * 2 + 2);
              lVar10 = 0;
              do {
                lVar10 = lVar10 + -1;
              } while ((ulong)uVar8 - (ulong)uVar6 != lVar10);
              uVar8 = uVar8 - (int)lVar10;
            }
            iVar7 = (int)uVar19 >> 3;
            if ((puVar2 < puVar21) && (puVar15 < (uint *)((long)iVar7 + (long)puVar21))) {
              uVar18 = uVar18 >> 2;
            }
            else {
              if (3 < iVar7) {
                __assert_fail("(bitCount >> 3) <= 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0xa16,
                              "size_t FSE_readNCount(short *, unsigned int *, unsigned int *, const void *, size_t)"
                             );
              }
              puVar3 = (uint *)((long)puVar21 + (long)iVar7);
              puVar21 = (uint *)((long)puVar21 + (long)iVar7);
              uVar19 = uVar19 & 7;
              uVar18 = *puVar3 >> (sbyte)uVar19;
            }
          }
          uVar5 = uVar8;
          if (uVar4 < uVar6) {
            return 0xffffffffffffffd0;
          }
        }
        uVar8 = iVar13 * 2 - 1;
        uVar6 = uVar8 - iVar16;
        uVar12 = iVar13 - 1U & uVar18;
        if (uVar12 < uVar6) {
          iVar7 = iVar20 + -1;
        }
        else {
          uVar18 = uVar18 & uVar8;
          if ((int)uVar18 < iVar13) {
            uVar6 = 0;
          }
          uVar12 = uVar18 - uVar6;
          iVar7 = iVar20;
        }
        iVar1 = uVar12 - 1;
        iVar14 = 1 - uVar12;
        if (0 < (int)uVar12) {
          iVar14 = iVar1;
        }
        iVar16 = iVar16 - iVar14;
        normalizedCounter[uVar5] = (short)iVar1;
        bVar22 = iVar1 != 0;
        for (; iVar16 < iVar13; iVar13 = iVar13 >> 1) {
          iVar20 = iVar20 + -1;
        }
        uVar19 = iVar7 + uVar19;
        if ((puVar2 < puVar21) && (puVar15 < (uint *)((long)((int)uVar19 >> 3) + (long)puVar21))) {
          uVar19 = uVar19 + ((int)puVar21 - (int)puVar15) * 8;
          puVar21 = puVar15;
        }
        else {
          puVar21 = (uint *)((long)puVar21 + (long)((int)uVar19 >> 3));
          uVar19 = uVar19 & 7;
        }
        uVar18 = *puVar21 >> ((byte)uVar19 & 0x1f);
      } while ((1 < iVar16) && (uVar8 = uVar5 + 1, uVar8 <= uVar4));
      sVar11 = 0xffffffffffffffec;
      if ((iVar16 == 1) && ((int)uVar19 < 0x21)) {
        *maxSVPtr = uVar5;
        sVar11 = (long)puVar21 + ((long)((int)(uVar19 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar11;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    /* init */
    memset(normalizedCounter, 0, (*maxSVPtr+1) * sizeof(normalizedCounter[0]));   /* all symbols not present in NCount have a frequency of 0 */
    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}